

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_peer.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::ipv4_peer::ipv4_peer(ipv4_peer *this,endpoint *ep,bool c,peer_source_flags_t src)

{
  undefined1 *puVar1;
  ushort uVar2;
  int iVar3;
  undefined7 in_register_00000011;
  bad_address_cast ex;
  bad_address_cast local_10;
  
  uVar2 = (ep->impl_).data_.v4.sin_port;
  (this->super_torrent_peer).prev_amount_upload = 0;
  (this->super_torrent_peer).prev_amount_download = 0;
  (this->super_torrent_peer).connection = (peer_connection_interface *)0x0;
  (this->super_torrent_peer).peer_rank = 0;
  (this->super_torrent_peer).last_optimistically_unchoked = 0;
  (this->super_torrent_peer).last_connected = 0;
  (this->super_torrent_peer).port = uVar2 << 8 | uVar2 >> 8;
  (this->super_torrent_peer).hashfails = '\0';
  iVar3 = (src.m_val & 0x3f) * 0x20000 + (int)CONCAT71(in_register_00000011,c) * 0x20 + 0x10000000;
  *(int *)&(this->super_torrent_peer).field_0x1b = iVar3;
  puVar1 = &(this->super_torrent_peer).field_0x1f;
  *puVar1 = *puVar1 & 0xfe;
  if ((ep->impl_).data_.base.sa_family == 2) {
    (this->addr).addr_.s_addr = (ep->impl_).data_.v4.sin_addr.s_addr;
    *(int *)&(this->super_torrent_peer).field_0x1b = iVar3;
    return;
  }
  local_10 = (bad_address_cast)&PTR__bad_cast_004decf0;
  boost::throw_exception<boost::asio::ip::bad_address_cast>(&local_10);
}

Assistant:

ipv4_peer::ipv4_peer(tcp::endpoint const& ep, bool c
		, peer_source_flags_t const src)
		: torrent_peer(ep.port(), c, src)
		, addr(ep.address().to_v4())
	{
		is_v6_addr = false;
#if TORRENT_USE_I2P
		is_i2p_addr = false;
#endif
#if TORRENT_USE_RTC
		is_rtc_addr = false;
#endif
	}